

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

int exr_add_channel(exr_context_t ctxt,int part_index,char *name,exr_pixel_type_t ptype,
                   exr_perceptual_treatment_t islinear,int32_t xsamp,int32_t ysamp)

{
  long lVar1;
  long lVar2;
  int iVar3;
  exr_result_t eVar4;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar5;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    iVar3 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return iVar3;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar5 = 0x15;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x0) {
      lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      lVar2 = *(long *)(lVar1 + 0x20);
      if (lVar2 == 0) {
        iVar3 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)(lVar1 + 8),"channels",
                                  EXR_ATTR_CHLIST,0,(uint8_t **)0x0,
                                  (exr_attribute_t **)(lVar1 + 0x20));
      }
      else {
        iVar3 = 0;
        if (*(int *)(lVar2 + 0x14) != 3) {
          iVar3 = (**(code **)(ctxt + 0x48))
                            (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             *(undefined8 *)(lVar2 + 8),"channels",*(code **)(ctxt + 0x48));
          return iVar3;
        }
      }
      if (iVar3 != 0) {
        return iVar3;
      }
      eVar4 = exr_attr_chlist_add(ctxt,((*(exr_attribute_t **)(lVar1 + 0x20))->field_6).chlist,name,
                                  ptype,islinear,xsamp,ysamp);
      return eVar4;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar5 = 8;
  }
  iVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar5);
  return iVar3;
}

Assistant:

exr_result_t
exr_add_channel (
    exr_context_t              ctxt,
    int                        part_index,
    const char*                name,
    exr_pixel_type_t           ptype,
    exr_perceptual_treatment_t islinear,
    int32_t                    xsamp,
    int32_t                    ysamp)
{
    REQ_ATTR_FIND_CREATE (channels, EXR_ATTR_CHLIST);
    if (rv == EXR_ERR_SUCCESS)
    {
        rv = exr_attr_chlist_add (
            ctxt, attr->chlist, name, ptype, islinear, xsamp, ysamp);
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}